

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
          (ReadPixelsTest *this,Context *context,TestSpec *spec)

{
  FramebufferType FVar1;
  deUint32 dVar2;
  TextureChannelClass TVar3;
  TextureFormat TVar4;
  
  gles3::TestCase::TestCase
            (&this->super_TestCase,context,(spec->name)._M_dataplus._M_p,
             (spec->description)._M_dataplus._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ReadPixelsTest_01e2af40;
  dVar2 = deStringHash((spec->name)._M_dataplus._M_p);
  deRandom_init(&(this->m_random).m_rnd,dVar2);
  this->m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this->m_program = (ShaderProgram *)0x0;
  FVar1 = spec->framebufferType;
  this->m_framebuffeType = FVar1;
  dVar2 = spec->renderbufferFormat;
  this->m_renderbufferFormat = dVar2;
  this->m_texChannelClass = TEXTURECHANNELCLASS_LAST;
  this->m_useColorClears = spec->useColorClear;
  this->m_renderTriangles = spec->renderTriangles;
  this->m_colorScale = 1.0;
  if (FVar1 == FRAMEBUFFERTYPE_RENDERBUFFER) {
    TVar4 = glu::mapGLInternalFormat(dVar2);
    TVar3 = tcu::getTextureChannelClass(TVar4.type);
    this->m_texChannelClass = TVar3;
    if (TVar3 - TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < 4) {
      this->m_colorScale =
           *(GLfloat *)
            (&DAT_01844ff0 + (ulong)(TVar3 - TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) * 4);
    }
  }
  return;
}

Assistant:

ReadPixelsTest::ReadPixelsTest (Context& context, const TestSpec& spec)
	: TestCase				(context, spec.name.c_str(), spec.description.c_str())
	, m_random				(deStringHash(spec.name.c_str()))
	, m_log					(m_testCtx.getLog())
	, m_program				(NULL)
	, m_framebuffeType		(spec.framebufferType)
	, m_renderbufferFormat	(spec.renderbufferFormat)
	, m_texChannelClass		(tcu::TEXTURECHANNELCLASS_LAST)
	, m_useColorClears		(spec.useColorClear)
	, m_renderTriangles		(spec.renderTriangles)
	, m_colorScale			(1.0f)
{

	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		m_colorScale = 1.0f;
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		m_texChannelClass = tcu::getTextureChannelClass(glu::mapGLInternalFormat(spec.renderbufferFormat).type);
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				m_colorScale = 1.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				m_colorScale = 100.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				m_colorScale = 100.0f;
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				m_colorScale = 100.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);
}